

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O2

void __thiscall llvm::yaml::Stream::printError(Stream *this,Node *N,Twine *Msg)

{
  ArrayRef<llvm::SMRange> Ranges;
  SMRange local_18;
  
  if (N == (Node *)0x0) {
    local_18.Start.Ptr = (char *)0x0;
    local_18.End.Ptr = (char *)0x0;
  }
  else {
    local_18.Start.Ptr = (N->SourceRange).Start.Ptr;
    local_18.End.Ptr = (N->SourceRange).End.Ptr;
  }
  Ranges.Length = 1;
  Ranges.Data = &local_18;
  Scanner::printError((this->scanner)._M_t.
                      super___uniq_ptr_impl<llvm::yaml::Scanner,_std::default_delete<llvm::yaml::Scanner>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_llvm::yaml::Scanner_*,_std::default_delete<llvm::yaml::Scanner>_>
                      .super__Head_base<0UL,_llvm::yaml::Scanner_*,_false>._M_head_impl,
                      local_18.Start,DK_Error,Msg,Ranges);
  return;
}

Assistant:

void Stream::printError(Node *N, const Twine &Msg) {
  SMRange Range = N ? N->getSourceRange() : SMRange();
  scanner->printError( Range.Start
                     , SourceMgr::DK_Error
                     , Msg
                     , Range);
}